

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

void __thiscall
IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::ProcessGroup
          (ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *this,uint numThreads)

{
  reference pvVar1;
  uint in_ESI;
  Semaphore *in_RDI;
  Semaphore *__new_size;
  uint i;
  reference in_stack_ffffffffffffffb8;
  Semaphore *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_00 = in_RDI;
  IlmThread_3_4::Semaphore::Semaphore(in_RDI,in_ESI);
  __new_size = in_RDI + 0x28;
  std::
  vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
            *)0x23844b);
  std::atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*>::atomic
            ((atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> *)this_00,
             in_stack_ffffffffffffffb8);
  std::atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  atomic((atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *)this_00,(__pointer_type)in_stack_ffffffffffffffb8);
  std::
  vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
  ::resize((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
            *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_type)__new_size);
  for (uVar2 = 0; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
    if (uVar2 == in_ESI - 1) {
      pvVar1 = std::
               vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
               ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                             *)(this_00 + 0x28),(ulong)uVar2);
      pvVar1->next = (TileProcess *)0x0;
    }
    else {
      in_stack_ffffffffffffffb8 =
           std::
           vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
           ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                         *)(this_00 + 0x28),(ulong)(uVar2 + 1));
      pvVar1 = std::
               vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
               ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                             *)(this_00 + 0x28),(ulong)uVar2);
      pvVar1->next = in_stack_ffffffffffffffb8;
    }
  }
  std::
  vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
  ::operator[]((vector<Imf_3_4::(anonymous_namespace)::TileProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::TileProcess>_>
                *)(this_00 + 0x28),0);
  std::atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*>::operator=
            ((atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> *)this_00,
             in_stack_ffffffffffffffb8);
  return;
}

Assistant:

ProcessGroup (unsigned int numThreads)
        : _sem (numThreads)
        , _avail_head (nullptr)
        , _first_failure (nullptr)
    {
        _fixed_pool.resize (numThreads);
        for ( unsigned int i = 0; i < numThreads; ++i )
        {
            if (i == (numThreads - 1))
                _fixed_pool[i].next = nullptr;
            else
                _fixed_pool[i].next = &(_fixed_pool[i+1]);
        }
        _avail_head = &(_fixed_pool[0]);
    }